

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.hh
# Opt level: O0

void __thiscall
OpenMesh::PropertyT<unsigned_short>::swap(PropertyT<unsigned_short> *this,size_t _i0,size_t _i1)

{
  reference __a;
  reference __b;
  size_t _i1_local;
  size_t _i0_local;
  PropertyT<unsigned_short> *this_local;
  
  __a = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[](&this->data_,_i0);
  __b = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::operator[](&this->data_,_i1);
  std::swap<unsigned_short>(__a,__b);
  return;
}

Assistant:

virtual void swap(size_t _i0, size_t _i1)
  { std::swap(data_[_i0], data_[_i1]); }